

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O0

void __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::Release
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this)

{
  undefined8 *puVar1;
  long in_RDI;
  IDestroy *pDestroy;
  int *pRefCount;
  INodeMap *pToDel;
  gcstring local_68 [80];
  int *local_18;
  INodeMap *local_10;
  
  if (*(long *)(in_RDI + 8) != 0) {
    local_10 = *(INodeMap **)(in_RDI + 8);
    local_18 = *(int **)(in_RDI + 0x60);
    *(undefined8 *)(in_RDI + 0x60) = 0;
    *(undefined8 *)(in_RDI + 8) = 0;
    GenICam_3_4::gcstring::gcstring(local_68,"Device");
    GenICam_3_4::gcstring::operator=((gcstring *)(in_RDI + 0x10),local_68);
    GenICam_3_4::gcstring::~gcstring(local_68);
    if ((local_18 != (int *)0x0) && (*local_18 = *local_18 + -1, *local_18 == 0)) {
      if (local_18 != (int *)0x0) {
        operator_delete(local_18);
      }
      local_18 = (int *)0x0;
      puVar1 = (undefined8 *)GenApi_3_4::CastToIDestroy(local_10);
      (**(code **)*puVar1)();
    }
  }
  return;
}

Assistant:

void GENAPI_NAMESPACE::CNodeMapRefT<TCameraParams>::Release()
    {
        if (_Ptr)
        {
            // Copy node map data for eventual later destruction
            INodeMap* pToDel = _Ptr;
            int* pRefCount = _pRefCount;

            // Clear
            _pRefCount = NULL;
            _Ptr = NULL;
            _DeviceName = "Device";

            assert(pRefCount);
            // Check if destruction is required
            if (pRefCount)
            {
                assert(*pRefCount > 0);
                --*pRefCount;
                if (*pRefCount == 0)
                {
                    // We do not need this anymore, all references are gone
                    delete pRefCount;
                    pRefCount = NULL;

                    // Destroy the node map finally
                    GENAPI_NAMESPACE::IDestroy *pDestroy = CastToIDestroy(pToDel);
                    assert(pDestroy);
                    pDestroy->Destroy(); //must not throw
                }
            }
        }
        else
        {
            // Must not have a refcount when no node map is there.
            assert(_pRefCount == NULL);
        }
    }